

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr.cc
# Opt level: O0

VarConcat * __thiscall kratos::VarConcat::concat(VarConcat *this,Var *var)

{
  reference ppVVar1;
  element_type *peVar2;
  enable_shared_from_this<kratos::Var> local_48;
  undefined1 local_38 [16];
  undefined1 local_28 [8];
  shared_ptr<kratos::VarConcat> result;
  Var *var_local;
  VarConcat *this_local;
  
  result.super___shared_ptr<kratos::VarConcat,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)var;
  Var::as<kratos::VarConcat>((Var *)local_38);
  std::enable_shared_from_this<kratos::Var>::shared_from_this(&local_48);
  std::
  make_shared<kratos::VarConcat,std::shared_ptr<kratos::VarConcat>,std::shared_ptr<kratos::Var>>
            ((shared_ptr<kratos::VarConcat> *)local_28,(shared_ptr<kratos::Var> *)local_38);
  std::shared_ptr<kratos::Var>::~shared_ptr((shared_ptr<kratos::Var> *)&local_48);
  std::shared_ptr<kratos::VarConcat>::~shared_ptr((shared_ptr<kratos::VarConcat> *)local_38);
  ppVVar1 = std::vector<kratos::Var_*,_std::allocator<kratos::Var_*>_>::operator[](&this->vars_,0);
  Var::add_concat_var(*ppVVar1,(shared_ptr<kratos::VarConcat> *)local_28);
  peVar2 = std::__shared_ptr_access<kratos::VarConcat,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator*((__shared_ptr_access<kratos::VarConcat,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      *)local_28);
  std::shared_ptr<kratos::VarConcat>::~shared_ptr((shared_ptr<kratos::VarConcat> *)local_28);
  return peVar2;
}

Assistant:

VarConcat &VarConcat::concat(kratos::Var &var) {
    auto result = std::make_shared<VarConcat>(as<VarConcat>(), var.shared_from_this());
    // add it to the first one
    vars_[0]->add_concat_var(result);
    return *result;
}